

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNQIn.cpp
# Opt level: O0

void __thiscall NaPNQueueInput::put_data(NaPNQueueInput *this,NaReal *pPortion)

{
  undefined4 *puVar1;
  NaReal *pNVar2;
  NaVector *in_RSI;
  long in_RDI;
  uint i;
  NaVector *this_00;
  uint in_stack_ffffffffffffffec;
  uint uVar3;
  
  if (in_RSI == (NaVector *)0x0) {
    puVar1 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar1 = 0;
    __cxa_throw(puVar1,&NaException::typeinfo,0);
  }
  NaVector::dim((NaVector *)(in_RDI + 200));
  NaVector::new_dim(in_RSI,in_stack_ffffffffffffffec);
  for (uVar3 = 0; uVar3 < *(uint *)(in_RDI + 0xe0); uVar3 = uVar3 + 1) {
    this_00 = (NaVector *)(&in_RSI->_vptr_NaVector)[uVar3];
    NaVector::dim((NaVector *)(in_RDI + 200));
    pNVar2 = NaVector::operator[](this_00,(uint)((ulong)(in_RDI + 200) >> 0x20));
    *pNVar2 = (NaReal)this_00;
  }
  return;
}

Assistant:

void
NaPNQueueInput::put_data (const NaReal* pPortion)
{
  if(NULL == pPortion)
    throw(na_null_pointer);

  unsigned	i;

  vQueue.new_dim(vQueue.dim() + nDataSize);

  for(i = 0; i < nDataSize; ++i){
    vQueue[vQueue.dim() + i - nDataSize] = pPortion[i];
  }
}